

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::StoreVersionFound(cmFindPackageCommand *this)

{
  ulong uVar1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_60;
  anon_class_8_1_8991fb9c local_40;
  anon_class_8_1_8991fb9c addDefinition;
  string ver;
  cmFindPackageCommand *this_local;
  
  cmStrCat<std::__cxx11::string&,char_const(&)[9]>
            ((string *)&addDefinition,&this->Name,(char (*) [9])0x12460cb);
  local_40.this = this;
  std::
  function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>::
  function<cmFindPackageCommand::StoreVersionFound()::__0&,void>
            ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_60,&local_40);
  SetVersionVariables(this,&local_60,(string *)&addDefinition,&this->VersionFound,
                      this->VersionFoundCount,this->VersionFoundMajor,this->VersionFoundMinor,
                      this->VersionFoundPatch,this->VersionFoundTweak);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function(&local_60);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).Makefile,(string *)&addDefinition);
  }
  std::__cxx11::string::~string((string *)&addDefinition);
  return;
}

Assistant:

void cmFindPackageCommand::StoreVersionFound()
{
  // Store the whole version string.
  std::string const ver = cmStrCat(this->Name, "_VERSION");
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->Makefile->AddDefinition(variable, value);
  };

  this->SetVersionVariables(addDefinition, ver, this->VersionFound,
                            this->VersionFoundCount, this->VersionFoundMajor,
                            this->VersionFoundMinor, this->VersionFoundPatch,
                            this->VersionFoundTweak);

  if (this->VersionFound.empty()) {
    this->Makefile->RemoveDefinition(ver);
  }
}